

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tag_util.hpp
# Opt level: O0

size_t mserialize::detail::tag_first_size(string_view tags)

{
  char cVar1;
  string_view s;
  string_view s_00;
  string_view s_01;
  string_view s_02;
  bool bVar2;
  const_iterator pcVar3;
  const_reference pcVar4;
  size_t sVar5;
  size_t in_RSI;
  char *in_RDI;
  char c;
  const_iterator __end2;
  const_iterator __begin2;
  string_view *__range2;
  size_t result;
  char close;
  undefined8 in_stack_ffffffffffffff90;
  char open;
  char *in_stack_ffffffffffffff98;
  size_t in_stack_ffffffffffffffa0;
  char *local_28;
  size_type local_18;
  string_view local_10;
  
  local_18 = 0;
  local_10._ptr = in_RDI;
  local_10._len = in_RSI;
  local_28 = string_view::begin(&local_10);
  pcVar3 = string_view::end(&local_10);
  for (; (local_28 != pcVar3 && (*local_28 == '[')); local_28 = local_28 + 1) {
    local_18 = local_18 + 1;
  }
  string_view::remove_prefix(&local_10,local_18);
  bVar2 = string_view::empty(&local_10);
  if (!bVar2) {
    pcVar4 = string_view::front(&local_10);
    cVar1 = *pcVar4;
    close = (char)((ulong)in_stack_ffffffffffffff90 >> 0x30);
    open = (char)((ulong)in_stack_ffffffffffffff90 >> 0x38);
    if (cVar1 == '(') {
      s._len = in_stack_ffffffffffffffa0;
      s._ptr = in_stack_ffffffffffffff98;
      sVar5 = size_between_balanced(s,open,close);
      local_18 = sVar5 + local_18;
    }
    else if (cVar1 == '/') {
      s_02._len = in_stack_ffffffffffffffa0;
      s_02._ptr = in_stack_ffffffffffffff98;
      sVar5 = size_between_balanced
                        (s_02,(char)(local_10._len >> 0x38),(char)(local_10._len >> 0x30));
      local_18 = sVar5 + local_18;
    }
    else if (cVar1 == '<') {
      s_00._len = in_stack_ffffffffffffffa0;
      s_00._ptr = in_stack_ffffffffffffff98;
      sVar5 = size_between_balanced(s_00,open,close);
      local_18 = sVar5 + local_18;
    }
    else if (cVar1 == '{') {
      s_01._len = local_10._len;
      s_01._ptr = local_10._ptr;
      sVar5 = size_between_balanced(s_01,open,close);
      local_18 = sVar5 + local_18;
    }
    else {
      local_18 = local_18 + 1;
    }
  }
  return local_18;
}

Assistant:

inline std::size_t tag_first_size(string_view tags)
{
  std::size_t result = 0;
  for (char c : tags)
  {
    if (c != '[') { break; }
    ++result;
  }
  tags.remove_prefix(result);

  if (! tags.empty())
  {
    switch (tags.front())
    {
    case '(':
      result += size_between_balanced(tags, '(', ')');
      break;
    case '<':
      result += size_between_balanced(tags, '<', '>');
      break;
    case '{':
      result += size_between_balanced(tags, '{', '}');
      break;
    case '/':
      result += size_between_balanced(tags, '/', '\\');
      break;
    default:
      result += 1; // assume arithmetic
      break;
    }
  }

  return result;
}